

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Call(UA_Server *server,UA_Session *session,UA_CallRequest *request,
                 UA_CallResponse *response)

{
  UA_CallMethodResult *pUVar1;
  uint local_70;
  uint local_68;
  uint local_64;
  ulong local_58;
  size_t i;
  UA_CallResponse *response_local;
  UA_CallRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_68 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = session->channel->connection->sockfd;
    }
    local_68 = local_64;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing CallRequest"
               ,(ulong)local_68,(ulong)local_70,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->methodsToCallSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar1 = (UA_CallMethodResult *)UA_Array_new(request->methodsToCallSize,UA_TYPES + 0x25);
    response->results = pUVar1;
    if (response->results == (UA_CallMethodResult *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = request->methodsToCallSize;
      for (local_58 = 0; local_58 < request->methodsToCallSize; local_58 = local_58 + 1) {
        Service_Call_single(server,session,request->methodsToCall + local_58,
                            response->results + local_58);
      }
    }
  }
  return;
}

Assistant:

void Service_Call(UA_Server *server, UA_Session *session,
                  const UA_CallRequest *request,
                  UA_CallResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing CallRequest");
    if(request->methodsToCallSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->methodsToCallSize, &UA_TYPES[UA_TYPES_CALLMETHODRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->methodsToCallSize;

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_Boolean isExternal[request->methodsToCallSize];
    UA_UInt32 indices[request->methodsToCallSize];
    memset(isExternal, false, sizeof(UA_Boolean) * request->methodsToCallSize);
    for(size_t j = 0;j<server->externalNamespacesSize;++j) {
        size_t indexSize = 0;
        for(size_t i = 0;i < request->methodsToCallSize;++i) {
            if(request->methodsToCall[i].methodId.namespaceIndex != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->call(ens->ensHandle, &request->requestHeader, request->methodsToCall,
                       indices, (UA_UInt32)indexSize, response->results);
    }
#endif
    
    for(size_t i = 0; i < request->methodsToCallSize;++i){
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
        if(!isExternal[i])
#endif    
            Service_Call_single(server, session, &request->methodsToCall[i], &response->results[i]);
    }
}